

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

NETWORK_INTERFACE_DESCRIPTION *
create_network_interface_description(ifreq *ifr,NETWORK_INTERFACE_DESCRIPTION *previous_nid)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  LOGGER_LOG p_Var4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 uVar8;
  size_t local_d0;
  size_t local_c8;
  ulong local_c0;
  size_t local_b8;
  long local_b0;
  size_t local_a8;
  size_t local_a0;
  ulong local_98;
  size_t local_90;
  long local_88;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  size_t malloc_size_1;
  uchar *mac;
  char *ip_address;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t malloc_size;
  NETWORK_INTERFACE_DESCRIPTION *result;
  NETWORK_INTERFACE_DESCRIPTION *previous_nid_local;
  ifreq *ifr_local;
  
  uVar8 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  malloc_size = (size_t)malloc(0x20);
  if ((NETWORK_INTERFACE_DESCRIPTION *)malloc_size == (NETWORK_INTERFACE_DESCRIPTION *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                ,"create_network_interface_description",0x147,1,
                "Failed allocating NETWORK_INTERFACE_DESCRIPTION");
    }
  }
  else {
    sVar5 = strlen((char *)ifr);
    if (sVar5 < 0xfffffffffffffffe) {
      sVar5 = strlen((char *)ifr);
      local_88 = sVar5 + 1;
    }
    else {
      local_88 = -1;
    }
    if (local_88 == 0) {
      local_90 = 0;
    }
    else {
      sVar5 = strlen((char *)ifr);
      if (sVar5 < 0xfffffffffffffffe) {
        sVar5 = strlen((char *)ifr);
        local_98 = sVar5 + 1;
      }
      else {
        local_98 = 0xffffffffffffffff;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_98;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) == 0) {
        local_a8 = 0xffffffffffffffff;
      }
      else {
        sVar5 = strlen((char *)ifr);
        if (sVar5 < 0xfffffffffffffffe) {
          local_a0 = strlen((char *)ifr);
          local_a0 = local_a0 + 1;
        }
        else {
          local_a0 = 0xffffffffffffffff;
        }
        local_a8 = local_a0;
      }
      local_90 = local_a8;
    }
    if (local_90 == 0xffffffffffffffff) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                  ,"create_network_interface_description",0x14b,1,"invalid malloc size");
      }
      destroy_network_interface_descriptions((NETWORK_INTERFACE_DESCRIPTION *)malloc_size);
      malloc_size = 0;
    }
    else {
      pcVar6 = (char *)malloc(local_90);
      ((NETWORK_INTERFACE_DESCRIPTION *)malloc_size)->name = pcVar6;
      if (pcVar6 == (char *)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                    ,"create_network_interface_description",0x151,1,
                    "failed setting interface description name (malloc failed)");
        }
        destroy_network_interface_descriptions((NETWORK_INTERFACE_DESCRIPTION *)malloc_size);
        malloc_size = 0;
      }
      else {
        strcpy(((NETWORK_INTERFACE_DESCRIPTION *)malloc_size)->name,(char *)ifr);
        pcVar6 = (char *)malloc(0x12);
        ((NETWORK_INTERFACE_DESCRIPTION *)malloc_size)->mac_address = pcVar6;
        if (pcVar6 == (char *)0x0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                      ,"create_network_interface_description",0x160,1,
                      "failed formatting mac address (malloc failed) size:%zu",0x12);
          }
          destroy_network_interface_descriptions((NETWORK_INTERFACE_DESCRIPTION *)malloc_size);
          malloc_size = 0;
        }
        else {
          iVar3 = sprintf(((NETWORK_INTERFACE_DESCRIPTION *)malloc_size)->mac_address,
                          "%02X:%02X:%02X:%02X:%02X:%02X",
                          (ulong)(byte)(ifr->ifr_ifru).ifru_addr.sa_data[0],
                          (ulong)(byte)(ifr->ifr_ifru).ifru_addr.sa_data[1],
                          (ulong)(byte)(ifr->ifr_ifru).ifru_addr.sa_data[2],
                          (ulong)(byte)(ifr->ifr_ifru).ifru_addr.sa_data[3],
                          CONCAT44(uVar8,(uint)(byte)(ifr->ifr_ifru).ifru_addr.sa_data[4]),
                          (uint)(byte)(ifr->ifr_ifru).ifru_addr.sa_data[5]);
          if (iVar3 < 1) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                        ,"create_network_interface_description",0x166,1,
                        "failed formatting mac address (sprintf failed)");
            }
            destroy_network_interface_descriptions((NETWORK_INTERFACE_DESCRIPTION *)malloc_size);
            malloc_size = 0;
          }
          else {
            pcVar6 = inet_ntoa((in_addr)*(in_addr_t *)((long)&ifr->ifr_ifru + 4));
            if (pcVar6 == (char *)0x0) {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                          ,"create_network_interface_description",0x16c,1,
                          "failed setting the ip address (inet_ntoa failed)");
              }
              destroy_network_interface_descriptions((NETWORK_INTERFACE_DESCRIPTION *)malloc_size);
              malloc_size = 0;
            }
            else {
              sVar5 = strlen(pcVar6);
              if (sVar5 < 0xfffffffffffffffe) {
                sVar5 = strlen(pcVar6);
                local_b0 = sVar5 + 1;
              }
              else {
                local_b0 = -1;
              }
              if (local_b0 == 0) {
                local_b8 = 0;
              }
              else {
                sVar5 = strlen(pcVar6);
                if (sVar5 < 0xfffffffffffffffe) {
                  sVar5 = strlen(pcVar6);
                  local_c0 = sVar5 + 1;
                }
                else {
                  local_c0 = 0xffffffffffffffff;
                }
                auVar2._8_8_ = 0;
                auVar2._0_8_ = local_c0;
                if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0) == 0) {
                  local_d0 = 0xffffffffffffffff;
                }
                else {
                  sVar5 = strlen(pcVar6);
                  if (sVar5 < 0xfffffffffffffffe) {
                    local_c8 = strlen(pcVar6);
                    local_c8 = local_c8 + 1;
                  }
                  else {
                    local_c8 = 0xffffffffffffffff;
                  }
                  local_d0 = local_c8;
                }
                local_b8 = local_d0;
              }
              if (local_b8 == 0xffffffffffffffff) {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                            ,"create_network_interface_description",0x172,1,"invalid malloc size");
                }
                destroy_network_interface_descriptions((NETWORK_INTERFACE_DESCRIPTION *)malloc_size)
                ;
                malloc_size = 0;
              }
              else {
                pcVar7 = (char *)malloc(local_b8);
                ((NETWORK_INTERFACE_DESCRIPTION *)malloc_size)->ip_address = pcVar7;
                if (pcVar7 == (char *)0x0) {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                              ,"create_network_interface_description",0x178,1,
                              "failed setting the ip address (malloc failed)");
                  }
                  destroy_network_interface_descriptions
                            ((NETWORK_INTERFACE_DESCRIPTION *)malloc_size);
                  malloc_size = 0;
                }
                else {
                  strcpy(((NETWORK_INTERFACE_DESCRIPTION *)malloc_size)->ip_address,pcVar6);
                  ((NETWORK_INTERFACE_DESCRIPTION *)malloc_size)->next =
                       (NETWORK_INTERFACE_DESCRIPTION_TAG *)0x0;
                  if (previous_nid != (NETWORK_INTERFACE_DESCRIPTION *)0x0) {
                    previous_nid->next = (NETWORK_INTERFACE_DESCRIPTION_TAG *)malloc_size;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (NETWORK_INTERFACE_DESCRIPTION *)malloc_size;
}

Assistant:

static NETWORK_INTERFACE_DESCRIPTION* create_network_interface_description(struct ifreq *ifr, NETWORK_INTERFACE_DESCRIPTION* previous_nid)
{
    NETWORK_INTERFACE_DESCRIPTION* result;
    size_t malloc_size;

    if ((result = (NETWORK_INTERFACE_DESCRIPTION*)malloc(sizeof(NETWORK_INTERFACE_DESCRIPTION))) == NULL)
    {
        LogError("Failed allocating NETWORK_INTERFACE_DESCRIPTION");
    }
    else if ((malloc_size = safe_multiply_size_t(safe_add_size_t(strlen(ifr->ifr_name), 1), sizeof(char))) == SIZE_MAX)
    {
        LogError("invalid malloc size");
        destroy_network_interface_descriptions(result);
        result = NULL;
    }
    else if ((result->name = (char*)malloc(malloc_size)) == NULL)
    {
        LogError("failed setting interface description name (malloc failed)");
        destroy_network_interface_descriptions(result);
        result = NULL;
    }
    else
    {
        strcpy(result->name, ifr->ifr_name);

        char* ip_address;
        unsigned char* mac = (unsigned char*)ifr->ifr_hwaddr.sa_data;
        size_t malloc_size = safe_multiply_size_t(sizeof(char), MAC_ADDRESS_STRING_LENGTH);

        if (malloc_size == SIZE_MAX ||
                (result->mac_address = (char*)malloc(malloc_size)) == NULL)
        {
            LogError("failed formatting mac address (malloc failed) size:%zu", malloc_size);
            destroy_network_interface_descriptions(result);
            result = NULL;
        }
        else if (sprintf(result->mac_address, "%02X:%02X:%02X:%02X:%02X:%02X", mac[0],mac[1],mac[2],mac[3],mac[4],mac[5]) <= 0)
        {
            LogError("failed formatting mac address (sprintf failed)");
            destroy_network_interface_descriptions(result);
            result = NULL;
        }
        else if ((ip_address = inet_ntoa(((struct sockaddr_in*)&ifr->ifr_addr)->sin_addr)) == NULL)
        {
            LogError("failed setting the ip address (inet_ntoa failed)");
            destroy_network_interface_descriptions(result);
            result = NULL;
        }
        else if ((malloc_size = safe_multiply_size_t(safe_add_size_t(strlen(ip_address), 1), sizeof(char))) == SIZE_MAX)
        {
            LogError("invalid malloc size");
            destroy_network_interface_descriptions(result);
            result = NULL;
        }
        else if ((result->ip_address = (char*)malloc(malloc_size)) == NULL)
        {
            LogError("failed setting the ip address (malloc failed)");
            destroy_network_interface_descriptions(result);
            result = NULL;
        }
        else
        {
            strcpy(result->ip_address, ip_address);
            result->next = NULL;

            if (previous_nid != NULL)
            {
                previous_nid->next = result;
            }
        }
    }

    return result;
}